

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O0

int Lodtalk::CompiledMethod::stObjectAt(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SmallIntegerValue SVar3;
  size_t sVar4;
  uint8_t *puVar5;
  SmallIntegerValue index;
  Oop indexOop;
  CompiledMethod *self;
  Oop selfOop;
  InterpreterProxy *interpreter_local;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 1) {
    indexOop.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])();
    indexOop.field_0.uintValue._4_4_ = extraout_var_00;
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    index = CONCAT44(extraout_var_01,iVar2);
    bVar1 = Oop::isSmallInteger((Oop *)&index);
    if (bVar1) {
      SVar3 = Oop::decodeSmallInteger((Oop *)&index);
      if ((0 < SVar3) &&
         (sVar4 = getLiteralCount((CompiledMethod *)indexOop.field_0), SVar3 <= (long)(sVar4 + 1)))
      {
        puVar5 = ProtoObject::getFirstFieldPointer((ProtoObject *)indexOop.field_0);
        iVar2 = (*interpreter->_vptr_InterpreterProxy[0x17])
                          (interpreter,*(undefined8 *)(puVar5 + (SVar3 + -1) * 8));
        return iVar2;
      }
      interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
    }
    else {
      interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
    }
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int CompiledMethod::stObjectAt(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto selfOop = interpreter->getReceiver();
    auto self = reinterpret_cast<CompiledMethod*> (selfOop.pointer);

    auto indexOop = interpreter->getTemporary(0);
    if(!indexOop.isSmallInteger())
        return interpreter->primitiveFailed();

    auto index = indexOop.decodeSmallInteger();
    if(index < 1 || index > (SmallIntegerValue)self->getLiteralCount() + 1)
        return interpreter->primitiveFailed();

    return interpreter->returnOop(reinterpret_cast<Oop*> (self->getFirstFieldPointer())[index - 1]);
}